

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O2

void __thiscall UnitTest_lex4::Run(UnitTest_lex4 *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  allocator local_181;
  string local_180;
  LexerWrapper lexer;
  
  std::__cxx11::string::string
            ((string *)&local_180,
             "3 3.0 3.1416 314.16e-2 0.31416E1 0xff 0x0.1E 0xA23p-4 0X1.921FB54442D18P+1 0x",
             &local_181);
  anon_unknown.dwarf_3b64::LexerWrapper::LexerWrapper(&lexer,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  iVar2 = 9;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    iVar1 = anon_unknown.dwarf_3b64::LexerWrapper::GetToken(&lexer);
    if (iVar1 != 0x117) {
      std::__cxx11::string::string
                ((string *)&local_180,"\'lexer.GetToken() == luna::Token_Number\'",&local_181);
      UnitTestBase::Error(&this->super_UnitTestBase,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
    }
  }
  anon_unknown.dwarf_3b64::LexerWrapper::GetToken(&lexer);
  std::__cxx11::string::string
            ((string *)&local_180,"\'{ lexer.GetToken(); }\' has no luna::LexException",&local_181);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  anon_unknown.dwarf_3b64::LexerWrapper::~LexerWrapper(&lexer);
  return;
}

Assistant:

TEST_CASE(lex4)
{
    LexerWrapper lexer("3 3.0 3.1416 314.16e-2 0.31416E1 0xff 0x0.1E 0xA23p-4 0X1.921FB54442D18P+1"
                       " 0x");
    for (int i = 0; i < 9; ++i)
        EXPECT_TRUE(lexer.GetToken() == luna::Token_Number);

    EXPECT_EXCEPTION(luna::LexException, {
        lexer.GetToken();
    });
}